

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

Array * __thiscall
czh::parser::Parser::parse_array_abi_cxx11_(Array *__return_storage_ptr__,Parser *this)

{
  Token local_160;
  Token local_110;
  VT local_c0;
  Array *local_90;
  overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_caozhanhao[P]wxserver_thirdparty_libczh_include_libczh_parser_hpp:153:13),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_caozhanhao[P]wxserver_thirdparty_libczh_include_libczh_parser_hpp:154:13),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_caozhanhao[P]wxserver_thirdparty_libczh_include_libczh_parser_hpp:155:13)>
  local_88 [3];
  Token local_70;
  undefined1 local_19;
  Parser *local_18;
  Parser *this_local;
  Array *ret;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  std::
  vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(__return_storage_ptr__);
  get(&local_70,this);
  czh::token::Token::operator=(&this->curr_tok,&local_70);
  czh::token::Token::~Token(&local_70);
  while ((this->curr_tok).type != ARR_RP) {
    if ((this->curr_tok).type != COMMA) {
      local_90 = __return_storage_ptr__;
      local_88[0].super_anon_class_8_1_ba1d7401.ret =
           (anon_class_8_1_ba1d7401)(anon_class_8_1_ba1d7401)__return_storage_ptr__;
      czh::value::Value::get_variant_abi_cxx11_(&local_c0,&(this->curr_tok).what);
      std::
      visit<czh::utils::overloaded<czh::parser::Parser::parse_array[abi:cxx11]()::_lambda(auto:1&&)_1_,czh::parser::Parser::parse_array[abi:cxx11]()::_lambda(czh::value::Reference)_1_,czh::parser::Parser::parse_array[abi:cxx11]()::_lambda(std::vector<std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string>,std::allocator<std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string>>>)_1_>,std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string,czh::value::Reference,std::vector<std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string>,std::allocator<std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string>>>>>
                (local_88,&local_c0);
      std::
      variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~variant(&local_c0);
    }
    get(&local_110,this);
    czh::token::Token::operator=(&this->curr_tok,&local_110);
    czh::token::Token::~Token(&local_110);
  }
  get(&local_160,this);
  czh::token::Token::operator=(&this->curr_tok,&local_160);
  czh::token::Token::~Token(&local_160);
  return __return_storage_ptr__;
}

Assistant:

value::Array parse_array()
    {
      value::Array ret;
      curr_tok = get();//eat [
      for (; curr_tok.type != token::TokenType::ARR_RP; curr_tok = get())
      {
        if (curr_tok.type == token::TokenType::COMMA) continue;
        std::visit(utils::overloaded{
            [&ret](auto &&a) { ret.insert(ret.end(), a); },
            [](value::Reference) { error::czh_unreachable(); },
            [](value::Array) { error::czh_unreachable(); }
        }, curr_tok.what.get_variant());
      }
      curr_tok = get();//eat ]
      return ret;
    }